

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O2

section_t * get_section_by_id(int id)

{
  section_t *psVar1;
  section_t **ppsVar2;
  
  ppsVar2 = &root;
  while( true ) {
    psVar1 = *ppsVar2;
    if ((psVar1 == (section_t *)0x0) || (psVar1->id == id)) break;
    ppsVar2 = &psVar1->next;
  }
  return psVar1;
}

Assistant:

section_t* get_section_by_id(int id)
{
    section_t* ps = root;
    while (ps)
    {
        if (ps->id == id)
            break;
        ps = ps->next;
    }
    return ps;
}